

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall cfd::core::AdaptorSignature::AdaptorSignature(AdaptorSignature *this,string *data)

{
  ByteData local_30;
  string *local_18;
  string *data_local;
  AdaptorSignature *this_local;
  
  local_18 = data;
  data_local = (string *)this;
  ByteData::ByteData(&local_30,data);
  AdaptorSignature(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

AdaptorSignature::AdaptorSignature(const std::string &data)
    : AdaptorSignature(ByteData(data)) {}